

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool Catch::replaceInPlace(string *str,string *replaceThis,string *withThis)

{
  ulong uVar1;
  string *psVar2;
  long lVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  size_t i;
  bool replaced;
  string *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [32];
  string local_68 [32];
  string local_48 [32];
  ulong local_28;
  byte local_19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  string *local_8;
  
  local_19 = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_28 = std::__cxx11::string::find(in_RDI,(ulong)in_RSI);
  while (local_28 != 0xffffffffffffffff) {
    local_19 = 1;
    __rhs = local_88;
    std::__cxx11::string::substr((ulong)__rhs,(ulong)local_8);
    std::operator+(in_stack_ffffffffffffff18,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff10);
    psVar2 = local_8;
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)&stack0xffffffffffffff48,(ulong)psVar2);
    std::operator+(in_stack_ffffffffffffff48,__rhs);
    std::__cxx11::string::operator=(local_8,local_48);
    std::__cxx11::string::~string(local_48);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string((string *)local_88);
    uVar1 = local_28;
    lVar3 = std::__cxx11::string::size();
    lVar4 = std::__cxx11::string::size();
    if (uVar1 < (ulong)(lVar3 - lVar4)) {
      in_stack_ffffffffffffff10 = local_8;
      in_stack_ffffffffffffff18 = local_10;
      std::__cxx11::string::size();
      local_28 = std::__cxx11::string::find
                           (in_stack_ffffffffffffff10,(ulong)in_stack_ffffffffffffff18);
    }
    else {
      local_28 = 0xffffffffffffffff;
    }
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool replaceInPlace( std::string& str, std::string const& replaceThis, std::string const& withThis ) {
        bool replaced = false;
        std::size_t i = str.find( replaceThis );
        while( i != std::string::npos ) {
            replaced = true;
            str = str.substr( 0, i ) + withThis + str.substr( i+replaceThis.size() );
            if( i < str.size()-withThis.size() )
                i = str.find( replaceThis, i+withThis.size() );
            else
                i = std::string::npos;
        }
        return replaced;
    }